

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O1

void __thiscall QBoxLayoutPrivate::~QBoxLayoutPrivate(QBoxLayoutPrivate *this)

{
  Data *pDVar1;
  Data *pDVar2;
  
  *(undefined ***)&this->super_QLayoutPrivate = &PTR__QBoxLayoutPrivate_007f38f8;
  pDVar1 = (this->geomArray).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->geomArray).d.d)->super_QArrayData,0x20,0x10);
    }
  }
  pDVar2 = (this->list).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->list).d.d)->super_QArrayData,8,0x10);
    }
  }
  QObjectPrivate::~QObjectPrivate((QObjectPrivate *)this);
  return;
}

Assistant:

QBoxLayoutPrivate::~QBoxLayoutPrivate()
{
}